

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.cpp
# Opt level: O1

uint crnlib::dxt5_block::get_block_values8(uint *pDst,uint l,uint h)

{
  *pDst = l;
  pDst[1] = h;
  pDst[2] = (h + l * 6) / 7;
  pDst[3] = (l * 5 + h * 2) / 7;
  pDst[4] = (h * 3 + l * 4) / 7;
  pDst[5] = (l * 3 + h * 4) / 7;
  pDst[6] = (h * 5 + l * 2) / 7;
  pDst[7] = (l + h * 6) / 7;
  return 8;
}

Assistant:

uint dxt5_block::get_block_values8(uint* pDst, uint l, uint h)
    {
        pDst[0] = l;
        pDst[1] = h;
        pDst[2] = (l * 6 + h) / 7;
        pDst[3] = (l * 5 + h * 2) / 7;
        pDst[4] = (l * 4 + h * 3) / 7;
        pDst[5] = (l * 3 + h * 4) / 7;
        pDst[6] = (l * 2 + h * 5) / 7;
        pDst[7] = (l + h * 6) / 7;
        return 8;
    }